

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screena.cpp
# Opt level: O3

void plot_robot(int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  lVar3 = 0x39;
  if (f_width == '\0') {
    lVar3 = 0;
  }
  auVar1 = SEXT816(lVar3 * ((robots[n].x + 5) / 10)) * SEXT816(0x20c49ba5e353f7cf);
  lVar3 = 0x16;
  if (f_height == '\0') {
    lVar3 = 0;
  }
  auVar2 = SEXT816(lVar3 * ((robots[n].y + 5) / 10)) * SEXT816(-0x20c49ba5e353f7cf);
  uVar4 = ((int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f)) + 2;
  uVar5 = (int)lVar3 + ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) + 2;
  if ((robots[n].last_x != uVar4) || (robots[n].last_y != uVar5)) {
    lVar3 = 0;
    do {
      if (((((ulong)(uint)n * 0xb8 - lVar3 != 0) && (robots[n].status != 0)) &&
          (uVar4 == *(uint *)(robots[0].name + lVar3 + 0x24))) &&
         (uVar5 == *(uint *)(robots[0].name + lVar3 + 0x28))) {
        return;
      }
      lVar3 = lVar3 + 0xb8;
    } while (lVar3 != 0x2e0);
    if (-1 < robots[n].last_y) {
      printf("\x1b[%d;%dH");
      putchar(0x20);
    }
    printf("\x1b[%d;%dH",(ulong)uVar5,(ulong)uVar4);
    putchar(n + 0x31);
    robots[n].last_x = uVar4;
    robots[n].last_y = uVar5;
  }
  return;
}

Assistant:

void plot_robot(int n)
{
  int i, k;
   int new_x, new_y;

  new_x = (int) (((long)((robots[n].x+(CLICK/2)) / CLICK) * f_width) / MAX_X);
  new_y = (int) (((long)((robots[n].y+(CLICK/2)) / CLICK) * f_height) / MAX_Y);
  /* add one to x and y for playfield offset in screen, and inverse y */
  new_x += 2;;
  new_y = f_height - new_y;
  new_y +=2;

  if (robots[n].last_x != new_x || robots[n].last_y != new_y) {
    /* check for conflict */
    k = 1;
    for (i = 0; i < MAXROBOTS; i++) {
      if (i == n || robots[n].status == DEAD)
	continue; /* same robot as n or inactive */
      if (new_x == robots[i].last_x && new_y == robots[i].last_y) {
	k = 0;
	break;	  /* conflict, robot in that position */
      }
    }
    if (k) {
      if (robots[n].last_y >= 0) {
	move(robots[n].last_y,robots[n].last_x);
	addch(' ');
      }
      move(new_y,new_x);
      addch(n+'1');  /* ASCII dependent */
      refresh();
      robots[n].last_x = new_x;
      robots[n].last_y = new_y;
    }
  }
}